

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

EdgeData<size_t> * __thiscall
geometrycentral::surface::SurfaceMesh::getEdgeIndices(SurfaceMesh *this)

{
  Edge e_00;
  undefined1 uVar1;
  MeshData<geometrycentral::surface::Edge,_unsigned_long> *in_RSI;
  ParentMeshT *in_RDI;
  Etype EVar2;
  Edge e;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __begin2;
  EdgeSet *__range2;
  size_t i;
  EdgeData<size_t> *indices;
  ParentMeshT *in_stack_ffffffffffffff18;
  SurfaceMesh *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff38;
  ParentMeshT *pPVar3;
  undefined1 local_40 [24];
  undefined1 *local_28;
  ParentMeshT *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  pPVar3 = in_RDI;
  MeshData<geometrycentral::surface::Edge,_unsigned_long>::MeshData(in_RSI,in_RDI);
  local_20 = (ParentMeshT *)0x0;
  edges(in_stack_ffffffffffffff20);
  local_28 = local_40;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_ffffffffffffff20);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_ffffffffffffff20);
  while (uVar1 = RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator!=
                           ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)
                            in_stack_ffffffffffffff20,
                            (RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)
                            in_stack_ffffffffffffff18), (bool)uVar1) {
    EVar2 = RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator*
                      ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)0x23452d);
    e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh.
    _7_1_ = uVar1;
    e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh.
    _0_7_ = in_stack_ffffffffffffff38;
    e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_RDI;
    in_stack_ffffffffffffff18 = local_20;
    in_stack_ffffffffffffff20 =
         (SurfaceMesh *)
         MeshData<geometrycentral::surface::Edge,_unsigned_long>::operator[]
                   ((MeshData<geometrycentral::surface::Edge,_unsigned_long> *)
                    EVar2.
                    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                    .mesh,e_00);
    in_stack_ffffffffffffff20->_vptr_SurfaceMesh = (_func_int **)in_stack_ffffffffffffff18;
    local_20 = (ParentMeshT *)((long)&local_20->_vptr_SurfaceMesh + 1);
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)in_stack_ffffffffffffff20)
    ;
  }
  return (EdgeData<size_t> *)pPVar3;
}

Assistant:

EdgeData<size_t> SurfaceMesh::getEdgeIndices() {
  EdgeData<size_t> indices(*this);
  size_t i = 0;
  for (Edge e : edges()) {
    indices[e] = i;
    i++;
  }
  return indices;
}